

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplerate.c
# Opt level: O3

long src_callback_read(SRC_STATE *state,double src_ratio,long frames,float *data)

{
  int iVar1;
  long lVar2;
  float *ptr;
  float dummy [1];
  float *local_80;
  SRC_DATA local_78;
  float local_34;
  
  if (0 < frames && state != (SRC_STATE *)0x0) {
    if (*(int *)(state + 0x18) == 0x22c) {
      if (*(long *)(state + 0x40) == 0) {
        *(undefined4 *)(state + 0x10) = 0x13;
      }
      else {
        local_78.input_frames_used = 0;
        local_78.output_frames_gen = 0;
        local_78.end_of_input = 0;
        local_78._52_4_ = 0;
        if ((src_ratio < 0.00390625) || (256.0 < src_ratio)) {
          *(undefined4 *)(state + 0x10) = 6;
        }
        else {
          local_78.data_in = *(float **)(state + 0x58);
          local_78.input_frames = *(long *)(state + 0x50);
          lVar2 = 0;
          local_78.data_out = data;
          local_78.output_frames = frames;
          local_78.src_ratio = src_ratio;
          while( true ) {
            if (local_78.input_frames == 0) {
              local_80 = &local_34;
              local_78.input_frames =
                   (**(code **)(state + 0x40))(*(undefined8 *)(state + 0x48),&local_80);
              local_78.data_in = local_80;
              if (local_78.input_frames == 0) {
                local_78.end_of_input = 1;
              }
            }
            *(undefined4 *)(state + 0x18) = 0x22b;
            iVar1 = src_process(state,&local_78);
            *(undefined4 *)(state + 0x18) = 0x22c;
            if (iVar1 != 0) break;
            local_78.input_frames = local_78.input_frames - local_78.input_frames_used;
            local_78.data_in =
                 local_78.data_in + local_78.input_frames_used * *(int *)(state + 0x14);
            local_78.data_out =
                 local_78.data_out + *(int *)(state + 0x14) * local_78.output_frames_gen;
            local_78.output_frames = local_78.output_frames - local_78.output_frames_gen;
            lVar2 = lVar2 + local_78.output_frames_gen;
            if ((local_78.output_frames_gen == 0 && local_78.end_of_input == 1) || (frames <= lVar2)
               ) {
              *(float **)(state + 0x58) = local_78.data_in;
              *(long *)(state + 0x50) = local_78.input_frames;
              return lVar2;
            }
          }
          *(float **)(state + 0x58) = local_78.data_in;
          *(long *)(state + 0x50) = local_78.input_frames;
          *(int *)(state + 0x10) = iVar1;
        }
      }
    }
    else {
      *(undefined4 *)(state + 0x10) = 0x12;
    }
  }
  return 0;
}

Assistant:

long
src_callback_read (SRC_STATE *state, double src_ratio, long frames, float *data)
{	SRC_PRIVATE	*psrc ;
	SRC_DATA	src_data ;

	long	output_frames_gen ;
	int		error = 0 ;

	if (state == NULL)
		return 0 ;

	if (frames <= 0)
		return 0 ;

	psrc = (SRC_PRIVATE*) state ;

	if (psrc->mode != SRC_MODE_CALLBACK)
	{	psrc->error = SRC_ERR_BAD_MODE ;
		return 0 ;
		} ;

	if (psrc->callback_func == NULL)
	{	psrc->error = SRC_ERR_NULL_CALLBACK ;
		return 0 ;
		} ;

	memset (&src_data, 0, sizeof (src_data)) ;

	/* Check src_ratio is in range. */
	if (is_bad_src_ratio (src_ratio))
	{	psrc->error = SRC_ERR_BAD_SRC_RATIO ;
		return 0 ;
		} ;

	/* Switch modes temporarily. */
	src_data.src_ratio = src_ratio ;
	src_data.data_out = data ;
	src_data.output_frames = frames ;

	src_data.data_in = psrc->saved_data ;
	src_data.input_frames = psrc->saved_frames ;

	output_frames_gen = 0 ;
	while (output_frames_gen < frames)
	{	/*	Use a dummy array for the case where the callback function
		**	returns without setting the ptr.
		*/
		float dummy [1] ;

		if (src_data.input_frames == 0)
		{	float *ptr = dummy ;

			src_data.input_frames = psrc->callback_func (psrc->user_callback_data, &ptr) ;
			src_data.data_in = ptr ;

			if (src_data.input_frames == 0)
				src_data.end_of_input = 1 ;
			} ;

		/*
		** Now call process function. However, we need to set the mode
		** to SRC_MODE_PROCESS first and when we return set it back to
		** SRC_MODE_CALLBACK.
		*/
		psrc->mode = SRC_MODE_PROCESS ;
		error = src_process (state, &src_data) ;
		psrc->mode = SRC_MODE_CALLBACK ;

		if (error != 0)
			break ;

		src_data.data_in += src_data.input_frames_used * psrc->channels ;
		src_data.input_frames -= src_data.input_frames_used ;

		src_data.data_out += src_data.output_frames_gen * psrc->channels ;
		src_data.output_frames -= src_data.output_frames_gen ;

		output_frames_gen += src_data.output_frames_gen ;

		if (src_data.end_of_input == SRC_TRUE && src_data.output_frames_gen == 0)
			break ;
		} ;

	psrc->saved_data = src_data.data_in ;
	psrc->saved_frames = src_data.input_frames ;

	if (error != 0)
	{	psrc->error = error ;
	 	return 0 ;
		} ;

	return output_frames_gen ;
}